

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

bool argagg::convert::parse_next_component<std::__cxx11::string>
               (char **s,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *out_arg,
               char delim)

{
  char *__s;
  char *pcVar1;
  undefined7 in_register_00000011;
  char *arg;
  char *arg_00;
  string local_68;
  convert *local_48;
  string arg_str;
  
  __s = *s;
  pcVar1 = strchr(__s,(int)CONCAT71(in_register_00000011,delim));
  *s = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,__s,(allocator<char> *)&local_68);
    arg<std::__cxx11::string>(&local_68,local_48,arg_00);
    std::__cxx11::string::operator=((string *)out_arg,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    local_48 = (convert *)&arg_str._M_string_length;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,__s,pcVar1);
    arg<std::__cxx11::string>(&local_68,local_48,arg);
    std::__cxx11::string::operator=((string *)out_arg,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    *s = *s + 1;
  }
  std::__cxx11::string::~string((string *)&local_48);
  return pcVar1 != (char *)0x0;
}

Assistant:

bool parse_next_component(
    const char*& s,
    T& out_arg,
    const char delim)
  {
    const char* begin = s;
    s = std::strchr(s, delim);
    if (s == nullptr) {
      std::string arg_str(begin);
      out_arg = argagg::convert::arg<T>(arg_str.c_str());
      return false;
    } else {
      std::string arg_str(begin, s - begin);
      out_arg = argagg::convert::arg<T>(arg_str.c_str());
      s += 1;
      return true;
    }
  }